

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

realtype N_VWSqrSumLocal_Serial(N_Vector x,N_Vector w)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  realtype rVar4;
  double dVar5;
  
  uVar1 = *x->content;
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  rVar4 = 0.0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    dVar5 = *(double *)(*(long *)((long)x->content + 8) + uVar3 * 8) *
            *(double *)(*(long *)((long)w->content + 8) + uVar3 * 8);
    rVar4 = rVar4 + dVar5 * dVar5;
  }
  return rVar4;
}

Assistant:

realtype N_VWSqrSumLocal_Serial(N_Vector x, N_Vector w)
{
  sunindextype i, N;
  realtype sum, prodi, *xd, *wd;

  sum = ZERO;
  xd = wd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  wd = NV_DATA_S(w);

  for (i = 0; i < N; i++) {
    prodi = xd[i]*wd[i];
    sum += SUNSQR(prodi);
  }

  return(sum);
}